

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::WasmByteCodeWriter::TryWriteAsmBrReg2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (WasmByteCodeWriter *this,OpCodeAsmJs op,ByteCodeLabel labelID,RegSlot R1,RegSlot R2)

{
  bool bVar1;
  size_t offsetOfRelativeJumpOffsetFromEnd;
  RegSlot RStack_28;
  OpLayoutT_BrInt2<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  RegSlot R2_local;
  RegSlot R1_local;
  ByteCodeLabel labelID_local;
  OpCodeAsmJs op_local;
  WasmByteCodeWriter *this_local;
  
  RStack_28 = R2;
  layout._2_4_ = R1;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>
                    ((uchar *)((long)&offsetOfRelativeJumpOffsetFromEnd + 6),R1);
  if ((bVar1) &&
     (bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>
                        ((uchar *)((long)&offsetOfRelativeJumpOffsetFromEnd + 7),RStack_28), bVar1))
  {
    offsetOfRelativeJumpOffsetFromEnd._2_4_ = 6;
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)0>
              (&(this->super_ByteCodeWriter).m_byteCodeData,op,
               (void *)((long)&offsetOfRelativeJumpOffsetFromEnd + 2),6,&this->super_ByteCodeWriter,
               false);
    AddJumpOffset(this,op,labelID,6);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmBrReg2(OpCodeAsmJs op, ByteCodeLabel labelID, RegSlot R1, RegSlot R2)
    {
        OpLayoutT_BrInt2<SizePolicy> layout;
        if (SizePolicy::Assign(layout.I1, R1) && SizePolicy::Assign(layout.I2, R2))
        {
            size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutT_BrInt2<SizePolicy>) - offsetof(OpLayoutT_BrInt2<SizePolicy>, RelativeJumpOffset);
            layout.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
            return true;
        }
        return false;
    }